

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O0

CURLcode connect_init(connectdata *conn,_Bool reinit)

{
  http_connect_state *local_28;
  http_connect_state *s;
  _Bool reinit_local;
  connectdata *conn_local;
  
  if (reinit) {
    local_28 = conn->connect_state;
  }
  else {
    local_28 = (http_connect_state *)(*Curl_ccalloc)(1,0x4028);
    if (local_28 == (http_connect_state *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    Curl_infof(conn->data,"allocate connect buffer!\n");
    conn->connect_state = local_28;
  }
  local_28->tunnel_state = TUNNEL_INIT;
  local_28->keepon = 1;
  local_28->line_start = local_28->connect_buffer;
  local_28->ptr = local_28->line_start;
  local_28->cl = 0;
  local_28->field_0x4024 = local_28->field_0x4024 & 0xfd;
  return CURLE_OK;
}

Assistant:

static CURLcode connect_init(struct connectdata *conn, bool reinit)
{
  struct http_connect_state *s;
  if(!reinit) {
    DEBUGASSERT(!conn->connect_state);
    s = calloc(1, sizeof(struct http_connect_state));
    if(!s)
      return CURLE_OUT_OF_MEMORY;
    infof(conn->data, "allocate connect buffer!\n");
    conn->connect_state = s;
  }
  else {
    DEBUGASSERT(conn->connect_state);
    s = conn->connect_state;
  }
  s->tunnel_state = TUNNEL_INIT;
  s->keepon = TRUE;
  s->line_start = s->connect_buffer;
  s->ptr = s->line_start;
  s->cl = 0;
  s->close_connection = FALSE;
  return CURLE_OK;
}